

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,
          cmListFileBacktrace *backtrace,string *destination,bool forceOpt,bool namelink)

{
  char *component_00;
  MessageLevel message_00;
  byte bVar1;
  bool exclude_from_all;
  bool bVar2;
  cmMakefile *mf;
  cmInstallTargetGenerator *this;
  string *psVar3;
  char *dest;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  byte local_102;
  char *local_b8;
  cmListFileBacktrace local_90 [2];
  string local_70;
  char *local_50;
  char *component;
  MessageLevel message;
  bool namelink_local;
  bool forceOpt_local;
  string *destination_local;
  cmListFileBacktrace *backtrace_local;
  cmInstallCommandArguments *pcStack_28;
  bool impLib_local;
  cmInstallCommandArguments *args_local;
  cmTarget *target_local;
  
  component._6_1_ = namelink;
  component._7_1_ = forceOpt;
  _message = destination;
  destination_local = (string *)backtrace;
  backtrace_local._7_1_ = impLib;
  pcStack_28 = args;
  args_local = (cmInstallCommandArguments *)target;
  mf = cmTarget::GetMakefile(target);
  component._0_4_ = cmInstallGenerator::SelectMessageLevel(mf,false);
  cmTarget::SetHaveInstallRule((cmTarget *)args_local,true);
  if ((component._6_1_ & 1) == 0) {
    cmInstallCommandArguments::GetComponent_abi_cxx11_(pcStack_28);
    local_b8 = (char *)std::__cxx11::string::c_str();
  }
  else {
    cmInstallCommandArguments::GetNamelinkComponent_abi_cxx11_(pcStack_28);
    local_b8 = (char *)std::__cxx11::string::c_str();
  }
  local_50 = local_b8;
  this = (cmInstallTargetGenerator *)operator_new(0x118);
  psVar3 = cmTarget::GetName_abi_cxx11_((cmTarget *)args_local);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar3);
  dest = (char *)std::__cxx11::string::c_str();
  bVar1 = backtrace_local._7_1_;
  cmInstallCommandArguments::GetPermissions_abi_cxx11_(pcStack_28);
  file_permissions = (char *)std::__cxx11::string::c_str();
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(pcStack_28);
  message_00 = (MessageLevel)component;
  component_00 = local_50;
  exclude_from_all = cmInstallCommandArguments::GetExcludeFromAll(pcStack_28);
  bVar2 = cmInstallCommandArguments::GetOptional(pcStack_28);
  local_102 = 1;
  if (!bVar2) {
    local_102 = component._7_1_;
  }
  cmListFileBacktrace::cmListFileBacktrace(local_90,(cmListFileBacktrace *)destination_local);
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,&local_70,dest,(bool)(bVar1 & 1),file_permissions,configurations,component_00,
             message_00,exclude_from_all,(bool)(local_102 & 1),local_90);
  cmListFileBacktrace::~cmListFileBacktrace(local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(
  cmTarget& target, const cmInstallCommandArguments& args, bool impLib,
  cmListFileBacktrace const& backtrace, const std::string& destination,
  bool forceOpt = false, bool namelink = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  const char* component = namelink ? args.GetNamelinkComponent().c_str()
                                   : args.GetComponent().c_str();
  return new cmInstallTargetGenerator(
    target.GetName(), destination.c_str(), impLib,
    args.GetPermissions().c_str(), args.GetConfigurations(), component,
    message, args.GetExcludeFromAll(), args.GetOptional() || forceOpt,
    backtrace);
}